

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

QWidget * __thiscall QScrollArea::takeWidget(QScrollArea *this)

{
  long lVar1;
  int *piVar2;
  QWidget *this_00;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  piVar2 = *(int **)(lVar1 + 0x2f8);
  if ((piVar2 == (int *)0x0) || (piVar2[1] == 0)) {
    this_00 = (QWidget *)0x0;
  }
  else {
    this_00 = *(QWidget **)(lVar1 + 0x300);
  }
  *(undefined8 *)(lVar1 + 0x2f8) = 0;
  *(undefined8 *)(lVar1 + 0x300) = 0;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  if (this_00 != (QWidget *)0x0) {
    QWidget::setParent(this_00,(QWidget *)0x0);
  }
  return this_00;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }